

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O3

map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
* __thiscall
adios2::Engine::AllStepsBlocksInfo
          (map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
           *__return_storage_ptr__,Engine *this,VariableNT *variable)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr *pp_Var2;
  Variable<signed_char> *variable_00;
  Engine *pointer;
  VariableBase *pointer_00;
  _Base_ptr p_Var3;
  iterator iVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  map<unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>_>_>
  *__range5;
  pointer pIVar7;
  _Base_ptr p_Var8;
  BPInfo *b;
  map<unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>_>_>
  blocksInfoT;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>_>_>
  local_178;
  Variable<std::complex<double>_> local_148;
  Variable<std::complex<float>_> local_140;
  Variable<long_double> local_138;
  Variable<double> local_130;
  Variable<float> local_128;
  Variable<unsigned_long> local_120;
  Variable<unsigned_int> local_118;
  Variable<unsigned_short> local_110;
  Variable<unsigned_char> local_108;
  Variable<long> local_100;
  Variable<int> local_f8;
  Variable<short> local_f0;
  Variable<signed_char> local_e8;
  Variable<char> local_e0;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  variable_00 = (Variable<signed_char> *)variable->m_Variable;
  switch(*(undefined4 *)(variable_00 + 0x28)) {
  case 1:
    Variable<signed_char>::Variable(&local_e8,variable_00);
    AllStepsBlocksInfo<signed_char>
              ((map<unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>_>_>
                *)&local_178,this,local_e8);
    for (p_Var6 = local_178._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &local_178._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      pmVar5 = std::
               map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)(p_Var6 + 1));
      p_Var3 = p_Var6[1]._M_left;
      for (p_Var8 = p_Var6[1]._M_parent; p_Var8 != p_Var3; p_Var8 = (_Base_ptr)&p_Var8[2]._M_right)
      {
        iVar4._M_current =
             (pmVar5->
             super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pmVar5->
            super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
          _M_realloc_insert<>(pmVar5,iVar4);
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (iVar4._M_current)->Step = 0;
          (iVar4._M_current)->IsReverseDims = false;
          (iVar4._M_current)->IsValue = false;
          *(undefined6 *)&(iVar4._M_current)->field_0x4a = 0;
          *(undefined8 *)&(iVar4._M_current)->WriterID = 0;
          (iVar4._M_current)->BlockID = 0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 1;
          (pmVar5->
          super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>).
          _M_impl.super__Vector_impl_data._M_finish = pIVar7;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Start,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)p_Var8
                  );
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Count,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var8->_M_right);
        pIVar7[-1].WriterID = *(int *)((long)&p_Var8[1]._M_left + 4);
        pIVar7[-1].Step = (size_t)*(pointer *)(p_Var8 + 2);
        pIVar7[-1].IsReverseDims = *(bool *)&p_Var8[2]._M_parent;
        pIVar7[-1].IsValue = *(bool *)((long)&p_Var8[2]._M_parent + 1);
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>_>_>
    ::~_Rb_tree(&local_178);
    break;
  case 2:
    Variable<short>::Variable(&local_f0,(Variable<short> *)variable_00);
    AllStepsBlocksInfo<short>
              ((map<unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>_>_>
                *)&local_178,this,local_f0);
    for (p_Var6 = local_178._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &local_178._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      pmVar5 = std::
               map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)(p_Var6 + 1));
      p_Var3 = p_Var6[1]._M_left;
      for (p_Var8 = p_Var6[1]._M_parent; p_Var8 != p_Var3; p_Var8 = p_Var8 + 3) {
        iVar4._M_current =
             (pmVar5->
             super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pmVar5->
            super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
          _M_realloc_insert<>(pmVar5,iVar4);
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (iVar4._M_current)->Step = 0;
          (iVar4._M_current)->IsReverseDims = false;
          (iVar4._M_current)->IsValue = false;
          *(undefined6 *)&(iVar4._M_current)->field_0x4a = 0;
          *(undefined8 *)&(iVar4._M_current)->WriterID = 0;
          (iVar4._M_current)->BlockID = 0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 1;
          (pmVar5->
          super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>).
          _M_impl.super__Vector_impl_data._M_finish = pIVar7;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Start,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)p_Var8
                  );
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Count,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var8->_M_right);
        pIVar7[-1].WriterID = *(int *)&p_Var8[1]._M_right;
        pIVar7[-1].Step = (size_t)p_Var8[2]._M_parent;
        pIVar7[-1].IsReverseDims = *(bool *)&p_Var8[2]._M_left;
        pIVar7[-1].IsValue = *(bool *)((long)&p_Var8[2]._M_left + 1);
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>_>_>
                 *)&local_178);
    break;
  case 3:
    Variable<int>::Variable(&local_f8,(Variable<int> *)variable_00);
    AllStepsBlocksInfo<int>
              ((map<unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>_>_>
                *)&local_178,this,local_f8);
    for (p_Var6 = local_178._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &local_178._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      pmVar5 = std::
               map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)(p_Var6 + 1));
      p_Var3 = p_Var6[1]._M_left;
      for (p_Var8 = p_Var6[1]._M_parent; p_Var8 != p_Var3; p_Var8 = p_Var8 + 3) {
        iVar4._M_current =
             (pmVar5->
             super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pmVar5->
            super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
          _M_realloc_insert<>(pmVar5,iVar4);
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (iVar4._M_current)->Step = 0;
          (iVar4._M_current)->IsReverseDims = false;
          (iVar4._M_current)->IsValue = false;
          *(undefined6 *)&(iVar4._M_current)->field_0x4a = 0;
          *(undefined8 *)&(iVar4._M_current)->WriterID = 0;
          (iVar4._M_current)->BlockID = 0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 1;
          (pmVar5->
          super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>).
          _M_impl.super__Vector_impl_data._M_finish = pIVar7;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Start,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)p_Var8
                  );
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Count,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var8->_M_right);
        pIVar7[-1].WriterID = *(int *)((long)&p_Var8[1]._M_right + 4);
        pIVar7[-1].Step = (size_t)p_Var8[2]._M_parent;
        pIVar7[-1].IsReverseDims = *(bool *)&p_Var8[2]._M_left;
        pIVar7[-1].IsValue = *(bool *)((long)&p_Var8[2]._M_left + 1);
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>_>_>
                 *)&local_178);
    break;
  case 4:
    Variable<long>::Variable(&local_100,(Variable<long> *)variable_00);
    AllStepsBlocksInfo<long>
              ((map<unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>_>_>
                *)&local_178,this,local_100);
    for (p_Var6 = local_178._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &local_178._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      pmVar5 = std::
               map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)(p_Var6 + 1));
      p_Var3 = p_Var6[1]._M_left;
      for (p_Var8 = p_Var6[1]._M_parent; p_Var8 != p_Var3; p_Var8 = (_Base_ptr)&p_Var8[3]._M_left) {
        iVar4._M_current =
             (pmVar5->
             super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pmVar5->
            super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
          _M_realloc_insert<>(pmVar5,iVar4);
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (iVar4._M_current)->Step = 0;
          (iVar4._M_current)->IsReverseDims = false;
          (iVar4._M_current)->IsValue = false;
          *(undefined6 *)&(iVar4._M_current)->field_0x4a = 0;
          *(undefined8 *)&(iVar4._M_current)->WriterID = 0;
          (iVar4._M_current)->BlockID = 0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 1;
          (pmVar5->
          super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>).
          _M_impl.super__Vector_impl_data._M_finish = pIVar7;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Start,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)p_Var8
                  );
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Count,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var8->_M_right);
        pIVar7[-1].WriterID = *(int *)&p_Var8[2]._M_parent;
        pIVar7[-1].Step = (size_t)p_Var8[2]._M_right;
        pIVar7[-1].IsReverseDims =
             *(bool *)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &p_Var8[3]._M_color)->_M_impl).super__Vector_impl_data._M_start;
        pIVar7[-1].IsValue =
             *(bool *)((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &p_Var8[3]._M_color)->_M_impl).super__Vector_impl_data._M_start + 1);
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>_>_>
                 *)&local_178);
    break;
  case 5:
    Variable<unsigned_char>::Variable(&local_108,(Variable<unsigned_char> *)variable_00);
    AllStepsBlocksInfo<unsigned_char>
              ((map<unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>_>_>
                *)&local_178,this,local_108);
    for (p_Var6 = local_178._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &local_178._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      pmVar5 = std::
               map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)(p_Var6 + 1));
      p_Var3 = p_Var6[1]._M_left;
      for (p_Var8 = p_Var6[1]._M_parent; p_Var8 != p_Var3; p_Var8 = (_Base_ptr)&p_Var8[2]._M_right)
      {
        iVar4._M_current =
             (pmVar5->
             super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pmVar5->
            super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
          _M_realloc_insert<>(pmVar5,iVar4);
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (iVar4._M_current)->Step = 0;
          (iVar4._M_current)->IsReverseDims = false;
          (iVar4._M_current)->IsValue = false;
          *(undefined6 *)&(iVar4._M_current)->field_0x4a = 0;
          *(undefined8 *)&(iVar4._M_current)->WriterID = 0;
          (iVar4._M_current)->BlockID = 0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 1;
          (pmVar5->
          super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>).
          _M_impl.super__Vector_impl_data._M_finish = pIVar7;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Start,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)p_Var8
                  );
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Count,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var8->_M_right);
        pIVar7[-1].WriterID = *(int *)((long)&p_Var8[1]._M_left + 4);
        pIVar7[-1].Step = (size_t)*(pointer *)(p_Var8 + 2);
        pIVar7[-1].IsReverseDims = *(bool *)&p_Var8[2]._M_parent;
        pIVar7[-1].IsValue = *(bool *)((long)&p_Var8[2]._M_parent + 1);
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>_>_>
                 *)&local_178);
    break;
  case 6:
    Variable<unsigned_short>::Variable(&local_110,(Variable<unsigned_short> *)variable_00);
    AllStepsBlocksInfo<unsigned_short>
              ((map<unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>_>_>
                *)&local_178,this,local_110);
    for (p_Var6 = local_178._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &local_178._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      pmVar5 = std::
               map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)(p_Var6 + 1));
      p_Var3 = p_Var6[1]._M_left;
      for (p_Var8 = p_Var6[1]._M_parent; p_Var8 != p_Var3; p_Var8 = p_Var8 + 3) {
        iVar4._M_current =
             (pmVar5->
             super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pmVar5->
            super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
          _M_realloc_insert<>(pmVar5,iVar4);
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (iVar4._M_current)->Step = 0;
          (iVar4._M_current)->IsReverseDims = false;
          (iVar4._M_current)->IsValue = false;
          *(undefined6 *)&(iVar4._M_current)->field_0x4a = 0;
          *(undefined8 *)&(iVar4._M_current)->WriterID = 0;
          (iVar4._M_current)->BlockID = 0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 1;
          (pmVar5->
          super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>).
          _M_impl.super__Vector_impl_data._M_finish = pIVar7;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Start,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)p_Var8
                  );
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Count,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var8->_M_right);
        pIVar7[-1].WriterID = *(int *)&p_Var8[1]._M_right;
        pIVar7[-1].Step = (size_t)p_Var8[2]._M_parent;
        pIVar7[-1].IsReverseDims = *(bool *)&p_Var8[2]._M_left;
        pIVar7[-1].IsValue = *(bool *)((long)&p_Var8[2]._M_left + 1);
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>_>_>
                 *)&local_178);
    break;
  case 7:
    Variable<unsigned_int>::Variable(&local_118,(Variable<unsigned_int> *)variable_00);
    AllStepsBlocksInfo<unsigned_int>
              ((map<unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>_>_>
                *)&local_178,this,local_118);
    for (p_Var6 = local_178._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &local_178._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      pmVar5 = std::
               map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)(p_Var6 + 1));
      p_Var3 = p_Var6[1]._M_left;
      for (p_Var8 = p_Var6[1]._M_parent; p_Var8 != p_Var3; p_Var8 = p_Var8 + 3) {
        iVar4._M_current =
             (pmVar5->
             super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pmVar5->
            super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
          _M_realloc_insert<>(pmVar5,iVar4);
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (iVar4._M_current)->Step = 0;
          (iVar4._M_current)->IsReverseDims = false;
          (iVar4._M_current)->IsValue = false;
          *(undefined6 *)&(iVar4._M_current)->field_0x4a = 0;
          *(undefined8 *)&(iVar4._M_current)->WriterID = 0;
          (iVar4._M_current)->BlockID = 0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 1;
          (pmVar5->
          super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>).
          _M_impl.super__Vector_impl_data._M_finish = pIVar7;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Start,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)p_Var8
                  );
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Count,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var8->_M_right);
        pIVar7[-1].WriterID = *(int *)((long)&p_Var8[1]._M_right + 4);
        pIVar7[-1].Step = (size_t)p_Var8[2]._M_parent;
        pIVar7[-1].IsReverseDims = *(bool *)&p_Var8[2]._M_left;
        pIVar7[-1].IsValue = *(bool *)((long)&p_Var8[2]._M_left + 1);
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>_>_>
                 *)&local_178);
    break;
  case 8:
    Variable<unsigned_long>::Variable(&local_120,(Variable<unsigned_long> *)variable_00);
    AllStepsBlocksInfo<unsigned_long>
              ((map<unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>_>_>
                *)&local_178,this,local_120);
    for (p_Var6 = local_178._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &local_178._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      pmVar5 = std::
               map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)(p_Var6 + 1));
      p_Var3 = p_Var6[1]._M_left;
      for (p_Var8 = p_Var6[1]._M_parent; p_Var8 != p_Var3; p_Var8 = (_Base_ptr)&p_Var8[3]._M_left) {
        iVar4._M_current =
             (pmVar5->
             super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pmVar5->
            super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
          _M_realloc_insert<>(pmVar5,iVar4);
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (iVar4._M_current)->Step = 0;
          (iVar4._M_current)->IsReverseDims = false;
          (iVar4._M_current)->IsValue = false;
          *(undefined6 *)&(iVar4._M_current)->field_0x4a = 0;
          *(undefined8 *)&(iVar4._M_current)->WriterID = 0;
          (iVar4._M_current)->BlockID = 0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 1;
          (pmVar5->
          super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>).
          _M_impl.super__Vector_impl_data._M_finish = pIVar7;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Start,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)p_Var8
                  );
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Count,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var8->_M_right);
        pIVar7[-1].WriterID = *(int *)&p_Var8[2]._M_parent;
        pIVar7[-1].Step = (size_t)p_Var8[2]._M_right;
        pIVar7[-1].IsReverseDims =
             *(bool *)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &p_Var8[3]._M_color)->_M_impl).super__Vector_impl_data._M_start;
        pIVar7[-1].IsValue =
             *(bool *)((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &p_Var8[3]._M_color)->_M_impl).super__Vector_impl_data._M_start + 1);
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>_>_>
                 *)&local_178);
    break;
  case 9:
    Variable<float>::Variable(&local_128,(Variable<float> *)variable_00);
    AllStepsBlocksInfo<float>
              ((map<unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>_>_>
                *)&local_178,this,local_128);
    for (p_Var6 = local_178._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &local_178._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      pmVar5 = std::
               map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)(p_Var6 + 1));
      p_Var3 = p_Var6[1]._M_left;
      for (p_Var8 = p_Var6[1]._M_parent; p_Var8 != p_Var3; p_Var8 = p_Var8 + 3) {
        iVar4._M_current =
             (pmVar5->
             super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pmVar5->
            super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
          _M_realloc_insert<>(pmVar5,iVar4);
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (iVar4._M_current)->Step = 0;
          (iVar4._M_current)->IsReverseDims = false;
          (iVar4._M_current)->IsValue = false;
          *(undefined6 *)&(iVar4._M_current)->field_0x4a = 0;
          *(undefined8 *)&(iVar4._M_current)->WriterID = 0;
          (iVar4._M_current)->BlockID = 0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 1;
          (pmVar5->
          super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>).
          _M_impl.super__Vector_impl_data._M_finish = pIVar7;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Start,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)p_Var8
                  );
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Count,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var8->_M_right);
        pIVar7[-1].WriterID = *(int *)((long)&p_Var8[1]._M_right + 4);
        pIVar7[-1].Step = (size_t)p_Var8[2]._M_parent;
        pIVar7[-1].IsReverseDims = *(bool *)&p_Var8[2]._M_left;
        pIVar7[-1].IsValue = *(bool *)((long)&p_Var8[2]._M_left + 1);
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>_>_>
                 *)&local_178);
    break;
  case 10:
    Variable<double>::Variable(&local_130,(Variable<double> *)variable_00);
    AllStepsBlocksInfo<double>
              ((map<unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>_>_>
                *)&local_178,this,local_130);
    for (p_Var6 = local_178._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &local_178._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      pmVar5 = std::
               map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)(p_Var6 + 1));
      p_Var3 = p_Var6[1]._M_left;
      for (p_Var8 = p_Var6[1]._M_parent; p_Var8 != p_Var3; p_Var8 = (_Base_ptr)&p_Var8[3]._M_left) {
        iVar4._M_current =
             (pmVar5->
             super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pmVar5->
            super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
          _M_realloc_insert<>(pmVar5,iVar4);
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (iVar4._M_current)->Step = 0;
          (iVar4._M_current)->IsReverseDims = false;
          (iVar4._M_current)->IsValue = false;
          *(undefined6 *)&(iVar4._M_current)->field_0x4a = 0;
          *(undefined8 *)&(iVar4._M_current)->WriterID = 0;
          (iVar4._M_current)->BlockID = 0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 1;
          (pmVar5->
          super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>).
          _M_impl.super__Vector_impl_data._M_finish = pIVar7;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Start,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)p_Var8
                  );
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Count,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var8->_M_right);
        pIVar7[-1].WriterID = *(int *)&p_Var8[2]._M_parent;
        pIVar7[-1].Step = (size_t)p_Var8[2]._M_right;
        pIVar7[-1].IsReverseDims =
             *(bool *)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &p_Var8[3]._M_color)->_M_impl).super__Vector_impl_data._M_start;
        pIVar7[-1].IsValue =
             *(bool *)((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &p_Var8[3]._M_color)->_M_impl).super__Vector_impl_data._M_start + 1);
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>_>_>
                 *)&local_178);
    break;
  case 0xb:
    Variable<long_double>::Variable(&local_138,(Variable<long_double> *)variable_00);
    AllStepsBlocksInfo<long_double>
              ((map<unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>_>_>
                *)&local_178,this,local_138);
    for (p_Var6 = local_178._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &local_178._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      pmVar5 = std::
               map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)(p_Var6 + 1));
      p_Var3 = p_Var6[1]._M_left;
      for (p_Var8 = p_Var6[1]._M_parent; p_Var8 != p_Var3; p_Var8 = (_Base_ptr)&p_Var8[4]._M_left) {
        iVar4._M_current =
             (pmVar5->
             super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pmVar5->
            super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
          _M_realloc_insert<>(pmVar5,iVar4);
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (iVar4._M_current)->Step = 0;
          (iVar4._M_current)->IsReverseDims = false;
          (iVar4._M_current)->IsValue = false;
          *(undefined6 *)&(iVar4._M_current)->field_0x4a = 0;
          *(undefined8 *)&(iVar4._M_current)->WriterID = 0;
          (iVar4._M_current)->BlockID = 0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 1;
          (pmVar5->
          super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>).
          _M_impl.super__Vector_impl_data._M_finish = pIVar7;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Start,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)p_Var8
                  );
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Count,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var8->_M_right);
        pIVar7[-1].WriterID =
             *(int *)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &p_Var8[3]._M_color)->_M_impl).super__Vector_impl_data._M_start;
        pIVar7[-1].Step = (size_t)p_Var8[3]._M_left;
        pIVar7[-1].IsReverseDims = *(bool *)&p_Var8[3]._M_right;
        pIVar7[-1].IsValue = *(bool *)((long)&p_Var8[3]._M_right + 1);
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>_>_>
                 *)&local_178);
    break;
  case 0xc:
    Variable<std::complex<float>_>::Variable
              (&local_140,(Variable<std::complex<float>_> *)variable_00);
    AllStepsBlocksInfo<std::complex<float>>
              ((map<unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>_>_>
                *)&local_178,this,local_140);
    for (p_Var6 = local_178._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &local_178._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      pmVar5 = std::
               map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)(p_Var6 + 1));
      p_Var3 = p_Var6[1]._M_left;
      for (p_Var8 = p_Var6[1]._M_parent; p_Var8 != p_Var3; p_Var8 = (_Base_ptr)&p_Var8[3]._M_left) {
        iVar4._M_current =
             (pmVar5->
             super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pmVar5->
            super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
          _M_realloc_insert<>(pmVar5,iVar4);
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (iVar4._M_current)->Step = 0;
          (iVar4._M_current)->IsReverseDims = false;
          (iVar4._M_current)->IsValue = false;
          *(undefined6 *)&(iVar4._M_current)->field_0x4a = 0;
          *(undefined8 *)&(iVar4._M_current)->WriterID = 0;
          (iVar4._M_current)->BlockID = 0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 1;
          (pmVar5->
          super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>).
          _M_impl.super__Vector_impl_data._M_finish = pIVar7;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Start,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)p_Var8
                  );
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Count,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var8->_M_right);
        pIVar7[-1].WriterID = *(int *)&p_Var8[2]._M_parent;
        pIVar7[-1].Step = (size_t)p_Var8[2]._M_right;
        pIVar7[-1].IsReverseDims =
             *(bool *)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &p_Var8[3]._M_color)->_M_impl).super__Vector_impl_data._M_start;
        pIVar7[-1].IsValue =
             *(bool *)((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &p_Var8[3]._M_color)->_M_impl).super__Vector_impl_data._M_start + 1);
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>_>_>
                 *)&local_178);
    break;
  case 0xd:
    Variable<std::complex<double>_>::Variable
              (&local_148,(Variable<std::complex<double>_> *)variable_00);
    AllStepsBlocksInfo<std::complex<double>>
              ((map<unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>_>_>
                *)&local_178,this,local_148);
    for (p_Var6 = local_178._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &local_178._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      pmVar5 = std::
               map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)(p_Var6 + 1));
      p_Var3 = p_Var6[1]._M_left;
      for (p_Var8 = p_Var6[1]._M_parent; p_Var8 != p_Var3; p_Var8 = (_Base_ptr)&p_Var8[4]._M_parent)
      {
        iVar4._M_current =
             (pmVar5->
             super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pmVar5->
            super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
          _M_realloc_insert<>(pmVar5,iVar4);
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (iVar4._M_current)->Step = 0;
          (iVar4._M_current)->IsReverseDims = false;
          (iVar4._M_current)->IsValue = false;
          *(undefined6 *)&(iVar4._M_current)->field_0x4a = 0;
          *(undefined8 *)&(iVar4._M_current)->WriterID = 0;
          (iVar4._M_current)->BlockID = 0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 1;
          (pmVar5->
          super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>).
          _M_impl.super__Vector_impl_data._M_finish = pIVar7;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Start,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)p_Var8
                  );
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Count,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var8->_M_right);
        pIVar7[-1].WriterID =
             *(int *)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &p_Var8[3]._M_color)->_M_impl).super__Vector_impl_data._M_start;
        pIVar7[-1].Step = (size_t)p_Var8[3]._M_left;
        pIVar7[-1].IsReverseDims = *(bool *)&p_Var8[3]._M_right;
        pIVar7[-1].IsValue = *(bool *)((long)&p_Var8[3]._M_right + 1);
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>_>_>
                 *)&local_178);
    break;
  case 0xe:
    Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Variable(&local_d8,
             (Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)variable_00);
    AllStepsBlocksInfo<std::__cxx11::string>
              ((map<unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>_>_>
                *)&local_178,this,local_d8);
    for (p_Var6 = local_178._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &local_178._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      pmVar5 = std::
               map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)(p_Var6 + 1));
      p_Var3 = p_Var6[1]._M_left;
      for (p_Var8 = p_Var6[1]._M_parent; p_Var8 != p_Var3; p_Var8 = (_Base_ptr)&p_Var8[5]._M_right)
      {
        iVar4._M_current =
             (pmVar5->
             super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pmVar5->
            super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
          _M_realloc_insert<>(pmVar5,iVar4);
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (iVar4._M_current)->Step = 0;
          (iVar4._M_current)->IsReverseDims = false;
          (iVar4._M_current)->IsValue = false;
          *(undefined6 *)&(iVar4._M_current)->field_0x4a = 0;
          *(undefined8 *)&(iVar4._M_current)->WriterID = 0;
          (iVar4._M_current)->BlockID = 0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 1;
          (pmVar5->
          super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>).
          _M_impl.super__Vector_impl_data._M_finish = pIVar7;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Start,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)p_Var8
                  );
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Count,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var8->_M_right);
        pIVar7[-1].WriterID = *(int *)&p_Var8[4]._M_left;
        pIVar7[-1].Step = (size_t)*(pointer *)(p_Var8 + 5);
        pIVar7[-1].IsReverseDims = *(bool *)&p_Var8[5]._M_parent;
        pIVar7[-1].IsValue = *(bool *)((long)&p_Var8[5]._M_parent + 1);
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>_>_>
                 *)&local_178);
    break;
  case 0xf:
    Variable<char>::Variable(&local_e0,(Variable<char> *)variable_00);
    AllStepsBlocksInfo<char>
              ((map<unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>_>_>
                *)&local_178,this,local_e0);
    for (p_Var6 = local_178._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &local_178._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      pmVar5 = std::
               map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)(p_Var6 + 1));
      p_Var3 = p_Var6[1]._M_left;
      for (p_Var8 = p_Var6[1]._M_parent; p_Var8 != p_Var3; p_Var8 = (_Base_ptr)&p_Var8[2]._M_right)
      {
        iVar4._M_current =
             (pmVar5->
             super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pmVar5->
            super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
          _M_realloc_insert<>(pmVar5,iVar4);
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (iVar4._M_current)->Step = 0;
          (iVar4._M_current)->IsReverseDims = false;
          (iVar4._M_current)->IsValue = false;
          *(undefined6 *)&(iVar4._M_current)->field_0x4a = 0;
          *(undefined8 *)&(iVar4._M_current)->WriterID = 0;
          (iVar4._M_current)->BlockID = 0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 1;
          (pmVar5->
          super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>).
          _M_impl.super__Vector_impl_data._M_finish = pIVar7;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Start,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)p_Var8
                  );
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Count,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var8->_M_right);
        pIVar7[-1].WriterID = *(int *)((long)&p_Var8[1]._M_left + 4);
        pIVar7[-1].Step = (size_t)*(pointer *)(p_Var8 + 2);
        pIVar7[-1].IsReverseDims = *(bool *)&p_Var8[2]._M_parent;
        pIVar7[-1].IsValue = *(bool *)((long)&p_Var8[2]._M_parent + 1);
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>_>_>
                 *)&local_178);
    break;
  case 0x10:
    pointer = this->m_Engine;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"for Engine in call to Engine::AllStepsBlocksInfo","");
    helper::CheckForNullptr<adios2::core::Engine>(pointer,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pointer_00 = variable->m_Variable;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"for variable in call to Engine::AllStepsBlocksInfo","");
    helper::CheckForNullptr<adios2::core::VariableBase>(pointer_00,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    adios2::core::Engine::AllStepsBlocksInfoStruct((VariableStruct *)&local_178);
    for (p_Var6 = local_178._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &local_178._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      pmVar5 = std::
               map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)(p_Var6 + 1));
      p_Var3 = p_Var6[1]._M_left;
      for (p_Var8 = p_Var6[1]._M_parent; p_Var8 != p_Var3; p_Var8 = (_Base_ptr)&p_Var8[6]._M_left) {
        iVar4._M_current =
             (pmVar5->
             super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pmVar5->
            super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
          _M_realloc_insert<>(pmVar5,iVar4);
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (iVar4._M_current)->Step = 0;
          (iVar4._M_current)->IsReverseDims = false;
          (iVar4._M_current)->IsValue = false;
          *(undefined6 *)&(iVar4._M_current)->field_0x4a = 0;
          *(undefined8 *)&(iVar4._M_current)->WriterID = 0;
          (iVar4._M_current)->BlockID = 0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ((iVar4._M_current)->Count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar4._M_current)->Start).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          pIVar7 = (pmVar5->
                   super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 1;
          (pmVar5->
          super__Vector_base<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>).
          _M_impl.super__Vector_impl_data._M_finish = pIVar7;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Start,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var8->_M_right);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pIVar7[-1].Count,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var8[1]._M_left);
        pIVar7[-1].WriterID = p_Var8[6]._M_color;
        pIVar7[-1].Step = (size_t)p_Var8[4]._M_left;
        pIVar7[-1].IsReverseDims = *(bool *)((long)&p_Var8[6]._M_parent + 1);
        pIVar7[-1].IsValue = *(bool *)&p_Var8[6]._M_parent;
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>_>_>
                 *)&local_178);
    break;
  default:
    pp_Var2 = &local_178._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_178._M_impl._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"bindings::CXX11","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Engine","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"AllStepsBlocksInfo","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"invalid data type","");
    helper::Throw<std::runtime_error>((string *)&local_178,&local_90,&local_b0,&local_d0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((_Base_ptr *)local_178._M_impl._0_8_ != pp_Var2) {
      operator_delete((void *)local_178._M_impl._0_8_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<size_t, std::vector<VariableNT::Info>>
Engine::AllStepsBlocksInfo(const VariableNT &variable) const
{
    std::map<size_t, std::vector<VariableNT::Info>> ret;
    if (variable.m_Variable->m_Type == DataType::Struct)
    {
        adios2::helper::CheckForNullptr(m_Engine,
                                        "for Engine in call to Engine::AllStepsBlocksInfo");
        adios2::helper::CheckForNullptr(variable.m_Variable,
                                        "for variable in call to Engine::AllStepsBlocksInfo");
        auto blocksInfo = m_Engine->AllStepsBlocksInfoStruct(
            *reinterpret_cast<core::VariableStruct *>(variable.m_Variable));
        for (const auto &bv : blocksInfo)
        {
            auto &bvr = ret[bv.first];
            for (const auto &b : bv.second)
            {
                bvr.emplace_back();
                auto &br = bvr.back();
                br.Start = b.Start;
                br.Count = b.Count;
                br.WriterID = b.WriterID;
                br.Step = b.Step;
                br.IsReverseDims = b.IsReverseDims;
                br.IsValue = b.IsValue;
            }
        }
    }
#define declare_type(T)                                                                            \
    else if (variable.m_Variable->m_Type == helper::GetDataType<T>())                              \
    {                                                                                              \
        auto blocksInfoT = AllStepsBlocksInfo(                                                     \
            Variable<T>(reinterpret_cast<core::Variable<T> *>(variable.m_Variable)));              \
        for (const auto &bv : blocksInfoT)                                                         \
        {                                                                                          \
            auto &bvr = ret[bv.first];                                                             \
            for (const auto &b : bv.second)                                                        \
            {                                                                                      \
                bvr.emplace_back();                                                                \
                auto &br = bvr.back();                                                             \
                br.Start = b.Start;                                                                \
                br.Count = b.Count;                                                                \
                br.WriterID = b.WriterID;                                                          \
                br.Step = b.Step;                                                                  \
                br.IsReverseDims = b.IsReverseDims;                                                \
                br.IsValue = b.IsValue;                                                            \
            }                                                                                      \
        }                                                                                          \
    }
    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    else
    {
        helper::Throw<std::runtime_error>("bindings::CXX11", "Engine", "AllStepsBlocksInfo",
                                          "invalid data type");
    }